

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olcPixelGameEngine.h
# Opt level: O3

rcode __thiscall olc::Sprite::SaveToPGESprFile(Sprite *this,string *sImageFile)

{
  char cVar1;
  rcode rVar2;
  ofstream ofs;
  long local_220;
  filebuf local_218 [240];
  ios_base local_128 [264];
  
  if (this->pColData == (Pixel *)0x0) {
    rVar2 = FAIL;
  }
  else {
    std::ofstream::ofstream((string *)&local_220);
    std::ofstream::open((string *)&local_220,(_Ios_Openmode)sImageFile);
    cVar1 = std::__basic_file<char>::is_open();
    if (cVar1 != '\0') {
      std::ostream::write((char *)&local_220,(long)this);
      std::ostream::write((char *)&local_220,(long)&this->height);
      std::ostream::write((char *)&local_220,(long)this->pColData);
      std::ofstream::close();
    }
    rVar2 = (rcode)(cVar1 != '\0');
    local_220 = _VTT;
    *(undefined8 *)(local_218 + *(long *)(_VTT + -0x18) + -8) = __M_split_cmpts;
    std::filebuf::~filebuf(local_218);
    std::ios_base::~ios_base(local_128);
  }
  return rVar2;
}

Assistant:

olc::rcode Sprite::SaveToPGESprFile(const std::string &sImageFile)
	{
		if (pColData == nullptr)
			return olc::FAIL;

		std::ofstream ofs;
		ofs.open(sImageFile, std::ifstream::binary);
		if (ofs.is_open())
		{
			ofs.write((char *)&width, sizeof(int32_t));
			ofs.write((char *)&height, sizeof(int32_t));
			ofs.write((char *)pColData, (size_t)width * (size_t)height * sizeof(uint32_t));
			ofs.close();
			return olc::OK;
		}

		return olc::FAIL;
	}